

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_enum_operators(writer *w,TypeDef *type)

{
  TypeDef *this;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  char *local_50;
  char *format;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  TypeDef *local_18;
  TypeDef *type_local;
  writer *w_local;
  
  local_18 = type;
  type_local = (TypeDef *)w;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"System");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,"FlagsAttribute");
  bVar1 = has_attribute<winmd::reader::TypeDef>(type,&local_28,(string_view *)&name._M_str);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    _format = winmd::reader::TypeDef::TypeName(local_18);
    this = type_local;
    local_50 = 
    "    constexpr auto operator|(% const left, % const right) noexcept\n    {\n        return static_cast<%>(impl::to_underlying_type(left) | impl::to_underlying_type(right));\n    }\n    constexpr auto operator|=(%& left, % const right) noexcept\n    {\n        left = left | right;\n        return left;\n    }\n    constexpr auto operator&(% const left, % const right) noexcept\n    {\n        return static_cast<%>(impl::to_underlying_type(left) & impl::to_underlying_type(right));\n    }\n    constexpr auto operator&=(%& left, % const right) noexcept\n    {\n        left = left & right;\n        return left;\n    }\n    constexpr auto operator~(% const value) noexcept\n    {\n        return static_cast<%>(~impl::to_underlying_type(value));\n    }\n    constexpr auto operator^^(% const left, % const right) noexcept\n    {\n        return static_cast<%>(impl::to_underlying_type(left) ^^ impl::to_underlying_type(right));\n    }\n    constexpr auto operator^^=(%& left, % const right) noexcept\n    {\n        left = left ^^ right;\n        return left;\n    }\n"
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,
               "    constexpr auto operator|(% const left, % const right) noexcept\n    {\n        return static_cast<%>(impl::to_underlying_type(left) | impl::to_underlying_type(right));\n    }\n    constexpr auto operator|=(%& left, % const right) noexcept\n    {\n        left = left | right;\n        return left;\n    }\n    constexpr auto operator&(% const left, % const right) noexcept\n    {\n        return static_cast<%>(impl::to_underlying_type(left) & impl::to_underlying_type(right));\n    }\n    constexpr auto operator&=(%& left, % const right) noexcept\n    {\n        left = left & right;\n        return left;\n    }\n    constexpr auto operator~(% const value) noexcept\n    {\n        return static_cast<%>(~impl::to_underlying_type(value));\n    }\n    constexpr auto operator^^(% const left, % const right) noexcept\n    {\n        return static_cast<%>(impl::to_underlying_type(left) ^^ impl::to_underlying_type(right));\n    }\n    constexpr auto operator^^=(%& left, % const right) noexcept\n    {\n        left = left ^^ right;\n        return left;\n    }\n"
              );
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              ((writer_base<cppwinrt::writer> *)this,&local_60,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format,
               (basic_string_view<char,_std::char_traits<char>_> *)&format);
  }
  return;
}

Assistant:

static void write_enum_operators(writer& w, TypeDef const& type)
    {
        if (!has_attribute(type, "System", "FlagsAttribute"))
        {
            return;
        }

        auto name = type.TypeName();

        auto format = R"(    constexpr auto operator|(% const left, % const right) noexcept
    {
        return static_cast<%>(impl::to_underlying_type(left) | impl::to_underlying_type(right));
    }
    constexpr auto operator|=(%& left, % const right) noexcept
    {
        left = left | right;
        return left;
    }
    constexpr auto operator&(% const left, % const right) noexcept
    {
        return static_cast<%>(impl::to_underlying_type(left) & impl::to_underlying_type(right));
    }
    constexpr auto operator&=(%& left, % const right) noexcept
    {
        left = left & right;
        return left;
    }
    constexpr auto operator~(% const value) noexcept
    {
        return static_cast<%>(~impl::to_underlying_type(value));
    }
    constexpr auto operator^^(% const left, % const right) noexcept
    {
        return static_cast<%>(impl::to_underlying_type(left) ^^ impl::to_underlying_type(right));
    }
    constexpr auto operator^^=(%& left, % const right) noexcept
    {
        left = left ^^ right;
        return left;
    }
)";

        w.write(format, name, name, name, name, name, name, name, name, name, name, name, name, name, name, name, name, name);
    }